

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_ConvolutionReverb.cpp
# Opt level: O1

void ConvolutionReverb::SetupImpulse(EffectData *data,int numchannels,int blocksize,int samplerate)

{
  int iVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  UnityComplexNumber *pUVar15;
  Channel *pCVar16;
  float *pfVar17;
  long lVar18;
  UnityComplexNumber **ppUVar19;
  int iVar20;
  int iVar21;
  ulong uVar22;
  long lVar23;
  long lVar24;
  size_t sVar25;
  ulong uVar26;
  uint uVar27;
  size_t sVar28;
  ulong uVar29;
  long lVar30;
  long lVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  double dVar38;
  float fVar39;
  float fVar40;
  MutexScopeLock mutexScope2;
  MutexScopeLock mutexScope1;
  uint local_c8;
  MutexScopeLock local_80;
  MutexScopeLock local_78;
  long local_70;
  ulong local_68;
  double local_60;
  EffectData *local_58;
  long local_50;
  ulong local_48;
  ulong local_40;
  float *local_38;
  
  local_78.mutex = data->mutex;
  Mutex::Lock(local_78.mutex);
  uVar11 = (uint)data->p[9];
  if (((data->numchannels == numchannels) && (data->hopsize == blocksize)) &&
     (data->samplerate == samplerate)) {
    if ((data->lastparams[2] == data->p[2]) && (!NAN(data->lastparams[2]) && !NAN(data->p[2]))) {
      if ((data->lastparams[3] == data->p[3]) && (!NAN(data->lastparams[3]) && !NAN(data->p[3]))) {
        if ((data->lastparams[4] == data->p[4]) && (!NAN(data->lastparams[4]) && !NAN(data->p[4])))
        {
          if ((data->lastparams[5] == data->p[5]) && (!NAN(data->lastparams[5]) && !NAN(data->p[5]))
             ) {
            if ((data->lastparams[6] == data->p[6]) &&
               (!NAN(data->lastparams[6]) && !NAN(data->p[6]))) {
              if ((data->lastparams[7] == data->p[7]) &&
                 (!NAN(data->lastparams[7]) && !NAN(data->p[7]))) {
                if (((data->lastparams[8] == data->p[8]) &&
                    (!NAN(data->lastparams[8]) && !NAN(data->p[8]))) &&
                   ((int)data->lastparams[9] == uVar11)) {
                  if ((data->lastparams[10] == data->p[10]) &&
                     (!NAN(data->lastparams[10]) && !NAN(data->p[10]))) {
                    if ((int)uVar11 < 0) goto LAB_0010c770;
                    if (GetIRSample(int)::initialized == '\0') {
                      memset(GetIRSample(int)::samples,0,0x4200);
                      GetIRSample(int)::initialized = '\x01';
                    }
                    if (*(int *)(GetIRSample(int)::samples + (ulong)uVar11 * 0x420 + 0x14) ==
                        globalupdatecount) goto LAB_0010c770;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  local_80.mutex = (Mutex *)sampleMutex;
  Mutex::Lock((Mutex *)sampleMutex);
  if (0 < data->numchannels) {
    lVar24 = 0;
    do {
      pCVar16 = data->channels + lVar24;
      if (0 < data->numpartitions) {
        lVar30 = 0;
        do {
          if (pCVar16->h[lVar30] != (UnityComplexNumber *)0x0) {
            operator_delete__(pCVar16->h[lVar30]);
          }
          if (pCVar16->x[lVar30] != (UnityComplexNumber *)0x0) {
            operator_delete__(pCVar16->x[lVar30]);
          }
          lVar30 = lVar30 + 1;
        } while (lVar30 < data->numpartitions);
      }
      if (pCVar16->h != (UnityComplexNumber **)0x0) {
        operator_delete__(pCVar16->h);
      }
      if (pCVar16->x != (UnityComplexNumber **)0x0) {
        operator_delete__(pCVar16->x);
      }
      if (pCVar16->s != (float *)0x0) {
        operator_delete__(pCVar16->s);
      }
      if (pCVar16->impulse != (float *)0x0) {
        operator_delete__(pCVar16->impulse);
      }
      lVar24 = lVar24 + 1;
    } while (lVar24 < data->numchannels);
  }
  if (data->channels != (Channel *)0x0) {
    operator_delete__(data->channels);
  }
  if (data->tmpoutput != (UnityComplexNumber *)0x0) {
    operator_delete__(data->tmpoutput);
  }
  uVar6 = *(undefined8 *)data->p;
  uVar7 = *(undefined8 *)(data->p + 2);
  uVar8 = *(undefined8 *)(data->p + 4);
  uVar9 = *(undefined8 *)(data->p + 6);
  uVar10 = *(undefined8 *)(data->p + 9);
  *(undefined8 *)(data->lastparams + 7) = *(undefined8 *)(data->p + 7);
  *(undefined8 *)(data->lastparams + 9) = uVar10;
  *(undefined8 *)(data->lastparams + 4) = uVar8;
  *(undefined8 *)(data->lastparams + 6) = uVar9;
  *(undefined8 *)data->lastparams = uVar6;
  *(undefined8 *)(data->lastparams + 2) = uVar7;
  data->bufferindex = 0;
  data->writeoffset = 0;
  data->numchannels = numchannels;
  data->hopsize = blocksize;
  data->fftsize = blocksize * 2;
  sVar28 = (long)(blocksize * 2) << 3;
  sVar25 = sVar28;
  if (blocksize < 0) {
    sVar25 = 0xffffffffffffffff;
  }
  pUVar15 = (UnityComplexNumber *)operator_new__(sVar25);
  data->tmpoutput = pUVar15;
  local_50 = (long)numchannels;
  uVar26 = local_50 << 5;
  if (numchannels < 0) {
    uVar26 = 0xffffffffffffffff;
  }
  pCVar16 = (Channel *)operator_new__(uVar26);
  data->channels = pCVar16;
  data->samplerate = samplerate;
  memset(pUVar15,0,sVar28);
  fVar37 = (float)samplerate;
  fVar32 = ceilf(data->p[2] * fVar37);
  if ((int)uVar11 < 0) {
LAB_0010bf18:
    iVar20 = (int)fVar32;
  }
  else {
    if (GetIRSample(int)::initialized == '\0') {
      memset(GetIRSample(int)::samples,0,0x4200);
      GetIRSample(int)::initialized = '\x01';
    }
    lVar24 = (ulong)uVar11 * 0x420;
    if (*(int *)(GetIRSample(int)::samples + lVar24 + 8) != 0) {
      fVar32 = ceilf(((float)*(int *)(GetIRSample(int)::samples + lVar24 + 8) * fVar37) /
                     (float)*(int *)(GetIRSample(int)::samples + lVar24 + 0x10));
      goto LAB_0010bf18;
    }
    iVar20 = 0x100;
  }
  iVar12 = 0;
  if (0 < iVar20) {
    iVar12 = iVar20;
  }
  iVar1 = data->hopsize;
  iVar12 = (iVar12 - (uint)(0 < iVar20)) / (iVar1 + (uint)(iVar1 == 0)) + (uint)(0 < iVar20);
  data->numpartitions = iVar12;
  if (0 < data->numchannels) {
    uVar27 = iVar1 * iVar12;
    local_40 = (long)(int)uVar27 * 4;
    if ((int)uVar27 < 0) {
      local_40 = 0xffffffffffffffff;
    }
    lVar30 = (ulong)uVar11 * 0x420;
    local_48 = (ulong)(uint)((int)uVar27 >> 1);
    local_60 = (double)(int)uVar27;
    uVar26 = (ulong)uVar27;
    local_70 = (ulong)(uint)numchannels << 2;
    local_68 = (ulong)(uVar27 - 1);
    lVar24 = uVar26 * 4;
    lVar31 = 0;
    local_58 = data;
    do {
      pCVar16 = data->channels + lVar31;
      pfVar17 = (float *)operator_new__(local_40);
      pCVar16->impulse = pfVar17;
      sVar25 = (long)data->fftsize * 4;
      sVar28 = sVar25;
      if ((long)data->fftsize < 0) {
        sVar28 = 0xffffffffffffffff;
      }
      pfVar17 = (float *)operator_new__(sVar28);
      pCVar16->s = pfVar17;
      memset(pfVar17,0,sVar25);
      fVar32 = sinf(data->p[6] * 0.7853982 * (1.0 / fVar37));
      fVar33 = sinf(data->p[7] * 0.7853982 * (1.0 / fVar37));
      local_c8 = local_c8 * 0x19660d + 0x3c6ef35f;
      fVar39 = data->p[8] * -0.89 + 0.9;
      fVar40 = (((float)(local_c8 & 0xffffff ^ local_c8 >> 0x10) * 0.01 * 5.960465e-08 + 0.0) *
                data->p[5] + -1.0) / (data->p[3] * (float)iVar20 * 0.01);
      if ((int)uVar11 < 0) {
        fVar34 = data->p[4];
        if (0 < (int)uVar27) {
          uVar29 = 0;
          do {
            fVar35 = expf((float)(int)uVar29 * fVar40);
            uVar14 = local_c8 * 0x19660d + 0x3c6ef35f;
            fVar36 = powf((float)(uVar14 & 0xffffff ^ uVar14 >> 0x10) * 0.9 * 5.960465e-08 + 0.1,
                          fVar34 * -0.09 + 10.0);
            local_c8 = local_c8 * 0x17385ca9 + 0x47502932;
            pCVar16->impulse[uVar29] =
                 fVar36 * fVar35 *
                 ((float)((local_c8 & 0xffffff ^ local_c8 >> 0x10) * 2) * 5.960465e-08 + -1.0);
            uVar29 = uVar29 + 1;
          } while (uVar26 != uVar29);
        }
      }
      else {
        if (GetIRSample(int)::initialized == '\0') {
          memset(GetIRSample(int)::samples,0,0x4200);
          GetIRSample(int)::initialized = '\x01';
        }
        if (*(int *)(GetIRSample(int)::samples + lVar30 + 8) == 0) {
          SetupImpulse::dummysample.data = SetupImpulse::dummydata;
          SetupImpulse::dummysample.numsamples = 0x100;
          SetupImpulse::dummysample.numchannels = numchannels;
          SetupImpulse::dummysample.samplerate = samplerate;
          if (0 < numchannels) {
            lVar18 = 0;
            do {
              *(undefined4 *)((long)SetupImpulse::dummydata + lVar18) = 0x3f800000;
              lVar18 = lVar18 + 4;
            } while (local_70 != lVar18);
          }
          memcpy(GetIRSample(int)::samples + lVar30,&SetupImpulse::dummysample,0x420);
        }
        iVar12 = numchannels + -1;
        if (lVar31 < local_50) {
          iVar12 = (int)lVar31;
        }
        if (0 < (int)uVar27) {
          iVar1 = *(int *)(GetIRSample(int)::samples + lVar30 + 0x10);
          iVar2 = *(int *)(GetIRSample(int)::samples + lVar30 + 8);
          lVar18 = *(long *)(GetIRSample(int)::samples + lVar30);
          iVar3 = *(int *)(GetIRSample(int)::samples + lVar30 + 0xc);
          local_38 = pCVar16->impulse;
          uVar29 = 0;
          do {
            fVar34 = (float)(int)uVar29 * ((float)iVar1 / fVar37);
            fVar35 = ceilf(fVar34);
            iVar13 = (int)fVar35;
            if (iVar2 <= (int)fVar35) {
              iVar13 = iVar2 + -1;
            }
            iVar21 = iVar13 + 1;
            if (iVar2 <= iVar13 + 1) {
              iVar21 = iVar2 + -1;
            }
            fVar35 = *(float *)(lVar18 + (long)(iVar13 * iVar3 + iVar12) * 4);
            local_38[uVar29] =
                 (*(float *)(lVar18 + (long)(iVar21 * iVar3 + iVar12) * 4) - fVar35) *
                 (fVar34 - (float)iVar13) + fVar35;
            uVar29 = uVar29 + 1;
          } while (uVar26 != uVar29);
        }
        *(int *)(GetIRSample(int)::samples + lVar30 + 0x14) = globalupdatecount;
        data = local_58;
      }
      fVar39 = fVar39 * fVar39;
      if (0 < (int)uVar27) {
        pfVar17 = pCVar16->impulse;
        fVar35 = 0.0;
        uVar29 = 0;
        fVar34 = 0.0;
        do {
          fVar36 = expf((float)(int)uVar29 * fVar40);
          fVar36 = fVar36 * ((fVar32 + fVar32) - (fVar33 + fVar33)) + fVar33 + fVar33;
          fVar34 = fVar36 * fVar35 + fVar34;
          fVar35 = ((pfVar17[uVar29] - fVar34) - fVar35 * fVar39) * fVar36 + fVar35;
          fVar34 = fVar36 * fVar35 + fVar34;
          fVar35 = fVar35 - (fVar35 * fVar39 + fVar34) * fVar36;
          pfVar17[uVar29] = (1.0 - fVar39 * fVar39) * 0.5 * fVar34;
          uVar29 = uVar29 + 1;
        } while (uVar26 != uVar29);
      }
      if ((0.5 < data->p[10]) && (0 < (int)local_48)) {
        pfVar17 = pCVar16->impulse;
        uVar22 = 0;
        uVar29 = local_68;
        do {
          fVar32 = pfVar17[uVar22];
          iVar12 = (int)uVar29;
          pfVar17[uVar22] = pfVar17[iVar12];
          pfVar17[iVar12] = fVar32;
          uVar22 = uVar22 + 1;
          uVar29 = (ulong)(iVar12 - 1);
        } while (local_48 != uVar22);
      }
      if ((int)uVar27 < 1) {
        fVar32 = 0.0;
      }
      else {
        fVar32 = 0.0;
        lVar18 = 0;
        do {
          fVar33 = *(float *)((long)pCVar16->impulse + lVar18);
          fVar32 = fVar32 + fVar33 * fVar33;
          lVar18 = lVar18 + 4;
        } while (lVar24 != lVar18);
      }
      if (fVar32 < 0.0) {
        fVar32 = sqrtf(fVar32);
      }
      else {
        fVar32 = SQRT(fVar32);
      }
      if (0 < (int)uVar27) {
        pfVar17 = pCVar16->impulse;
        lVar18 = 0;
        do {
          *(float *)((long)pfVar17 + lVar18) = *(float *)((long)pfVar17 + lVar18) * (1.0 / fVar32);
          lVar18 = lVar18 + 4;
        } while (lVar24 != lVar18);
      }
      uVar29 = (long)data->numpartitions * 8;
      if ((long)data->numpartitions < 0) {
        uVar29 = 0xffffffffffffffff;
      }
      ppUVar19 = (UnityComplexNumber **)operator_new__(uVar29);
      pCVar16->h = ppUVar19;
      ppUVar19 = (UnityComplexNumber **)operator_new__(uVar29);
      pCVar16->x = ppUVar19;
      if (0 < data->numpartitions) {
        pfVar17 = pCVar16->impulse;
        lVar18 = 0;
        do {
          sVar25 = (long)data->fftsize * 8;
          sVar28 = sVar25;
          if ((long)data->fftsize < 0) {
            sVar28 = 0xffffffffffffffff;
          }
          pUVar15 = (UnityComplexNumber *)operator_new__(sVar28);
          pCVar16->h[lVar18] = pUVar15;
          pUVar15 = (UnityComplexNumber *)operator_new__(sVar28);
          pCVar16->x[lVar18] = pUVar15;
          memset(pCVar16->x[lVar18],0,sVar25);
          memset(pCVar16->h[lVar18],0,(long)data->fftsize << 3);
          iVar12 = data->hopsize;
          if (0 < (long)iVar12) {
            pUVar15 = pCVar16->h[lVar18];
            lVar23 = 0;
            do {
              *(undefined4 *)((long)&pUVar15->re + lVar23 * 2) =
                   *(undefined4 *)((long)pfVar17 + lVar23);
              lVar23 = lVar23 + 4;
            } while ((long)iVar12 * 4 != lVar23);
            pfVar17 = (float *)((long)pfVar17 + lVar23);
          }
          FFT::Forward(pCVar16->h[lVar18],data->fftsize,false);
          lVar18 = lVar18 + 1;
        } while (lVar18 < data->numpartitions);
      }
      if ((int)uVar27 < 1) {
        dVar4 = 0.0;
      }
      else {
        pfVar17 = pCVar16->impulse;
        dVar38 = 0.0;
        lVar18 = 0;
        dVar4 = 0.0;
        do {
          dVar5 = (double)ABS(*(float *)((long)pfVar17 + lVar18));
          uVar29 = -(ulong)(dVar38 < dVar5);
          dVar38 = (double)(~uVar29 & (ulong)(dVar38 * 0.9900000095367432 + 9.999999717180685e-10) |
                           (ulong)dVar5 & uVar29);
          dVar4 = dVar4 + dVar38;
          *(float *)((long)pfVar17 + lVar18) = (float)dVar4;
          lVar18 = lVar18 + 4;
        } while (lVar24 != lVar18);
      }
      if (0 < (int)uVar27) {
        pfVar17 = pCVar16->impulse;
        dVar38 = 0.0;
        lVar18 = 0;
        do {
          *(float *)((long)pfVar17 + lVar18) = *(float *)((long)pfVar17 + lVar18) - (float)dVar38;
          dVar38 = dVar38 + dVar4 / local_60;
          lVar18 = lVar18 + 4;
        } while (lVar24 != lVar18);
      }
      lVar31 = lVar31 + 1;
    } while (lVar31 < data->numchannels);
  }
  MutexScopeLock::~MutexScopeLock(&local_80);
LAB_0010c770:
  MutexScopeLock::~MutexScopeLock(&local_78);
  return;
}

Assistant:

static void SetupImpulse(EffectData* data, int numchannels, int blocksize, int samplerate)
    {
        MutexScopeLock mutexScope1(*data->mutex);

        Random random;

        int usesample = (int)data->p[P_USESAMPLE];

        // if no parameters have changed, there's no need to recalculate the impulse
        if (data->numchannels == numchannels &&
            data->hopsize == blocksize &&
            data->samplerate == samplerate &&
            data->lastparams[P_TIME] == data->p[P_TIME] &&
            data->lastparams[P_DECAY] == data->p[P_DECAY] &&
            data->lastparams[P_DIFFUSION] == data->p[P_DIFFUSION] &&
            data->lastparams[P_STEREO] == data->p[P_STEREO] &&
            data->lastparams[P_CUTHI] == data->p[P_CUTHI] &&
            data->lastparams[P_CUTLO] == data->p[P_CUTLO] &&
            data->lastparams[P_RESONANCE] == data->p[P_RESONANCE] &&
            (int)data->lastparams[P_USESAMPLE] == usesample &&
            data->lastparams[P_REVERSE] == data->p[P_REVERSE] &&
            (usesample < 0 || GetIRSample(usesample).updatecount == globalupdatecount)
            )
            return;

        MutexScopeLock mutexScope2(sampleMutex);

        // delete old buffers (can be avoided if numchannels, numpartitions and hopsize stay the same)
        for (int i = 0; i < data->numchannels; i++)
        {
            Channel& c = data->channels[i];
            for (int k = 0; k < data->numpartitions; k++)
            {
                delete[] c.h[k];
                delete[] c.x[k];
            }
            delete[] c.h;
            delete[] c.x;
            delete[] c.s;
            delete[] c.impulse;
        }
        delete[] data->channels;
        delete[] data->tmpoutput;

        memcpy(data->lastparams, data->p, sizeof(data->p));

        // reinitialize data
        data->bufferindex = 0;
        data->writeoffset = 0;
        data->numchannels = numchannels;
        data->hopsize = blocksize;
        data->fftsize = blocksize * 2;
        data->tmpoutput = new UnityComplexNumber[data->fftsize];
        data->channels = new Channel[data->numchannels];
        data->samplerate = samplerate;

        memset(data->tmpoutput, 0, sizeof(UnityComplexNumber) * data->fftsize);

        // calculate length of impulse in samples
        int reallength = (int)ceilf(samplerate * data->p[P_TIME]);
        if (usesample >= 0)
        {
            IRSample& s = GetIRSample(usesample);
            if (s.numsamples == 0)
                reallength = 256;
            else
                reallength = (int)ceilf(s.numsamples * (float)samplerate / (float)s.samplerate);
        }

        // calculate length of impulse in samples as a multiple of the number of partitions processed
        data->numpartitions = 0;
        while (data->numpartitions * data->hopsize < reallength)
            data->numpartitions++;
        int impulsesamples = data->numpartitions * data->hopsize;

        // calculate individual impulse responses per channel
        float sampletime = 1.0f / (float)samplerate;
        for (int i = 0; i < data->numchannels; i++)
        {
            Channel& c = data->channels[i];
            c.impulse = new float[impulsesamples];
            c.s = new float[data->fftsize];
            memset(c.s, 0, sizeof(float) * data->fftsize);

            float cuthi = 2.0f * sinf(0.25f * kPI * data->p[P_CUTHI] * sampletime);
            float cutlo = 2.0f * sinf(0.25f * kPI * data->p[P_CUTLO] * sampletime);
            float bw = 0.9f - 0.89f * data->p[P_RESONANCE]; bw *= bw;
            float decayconst = (data->p[P_STEREO] * random.GetFloat(0.0f, 0.01f) - 1.0f) / (reallength * 0.01f * data->p[P_DECAY]);

            if (usesample < 0)
            {
                // calculate the impulse response as decaying white noise
                float d = 10.0f - 0.09f * data->p[P_DIFFUSION];
                for (int n = 0; n < impulsesamples; n++)
                {
                    float env = expf(decayconst * n);
                    c.impulse[n] = env * powf(random.GetFloat(0.1f, 1.0f), d) * random.GetFloat(-1.0f, 1.0f);
                }
            }
            else
            {
                IRSample& s = GetIRSample(usesample);
                if (s.numsamples == 0)
                {
                    static float dummydata[256 * 8];
                    static IRSample dummysample;
                    dummysample.data = dummydata;
                    dummysample.numchannels = numchannels;
                    dummysample.numsamples = 256;
                    dummysample.samplerate = samplerate;
                    for (int n = 0; n < numchannels; n++)
                        dummydata[n] = 1.0f;
                    s = dummysample;
                }

                int channel = (i < numchannels) ? i : (numchannels - 1);
                float speed = (float)s.samplerate / (float)samplerate;
                for (int n = 0; n < impulsesamples; n++)
                {
                    float fpos = n * speed;
                    int ipos1 = (int)ceilf(fpos);
                    if (ipos1 >= s.numsamples)
                        ipos1 = s.numsamples - 1;
                    int ipos2 = ipos1 + 1;
                    if (ipos2 >= s.numsamples)
                        ipos2 = s.numsamples - 1;
                    fpos -= ipos1;
                    float s1 = s.data[ipos1 * s.numchannels + channel];
                    float s2 = s.data[ipos2 * s.numchannels + channel];
                    c.impulse[n] = s1 + (s2 - s1) * fpos;
                }

                s.updatecount = globalupdatecount;
            }

            float lpf = 0.0f, bpf = 0.0f, gain = 0.5f * (1.0f - bw * bw);
            for (int n = 0; n < impulsesamples; n++)
            {
                float env = expf(decayconst * n);
                float cut = cutlo + (cuthi - cutlo) * env;
                lpf += cut * bpf;
                bpf += cut * (c.impulse[n] - lpf - bpf * bw);
                lpf += cut * bpf;
                bpf -= cut * (lpf + bpf * bw);
                c.impulse[n] = gain * lpf;
                //c.impulse[n] = env * sinf(n * 2.0f * 3.1415926f * 1000.0f / 44100.0f); // damped sine -- useful for debugging with click input signals
            }

            if (data->p[P_REVERSE] > 0.5f)
            {
                int len = impulsesamples >> 1;
                for (int n = 0; n < len; n++)
                {
                    float tmp = c.impulse[n];
                    c.impulse[n] = c.impulse[impulsesamples - 1 - n];
                    c.impulse[impulsesamples - 1 - n] = tmp;
                }
            }

            // measure signal power
            float power = 0.0f;
            for (int n = 0; n < impulsesamples; n++)
                power += c.impulse[n] * c.impulse[n];

            // normalize gain
            float scale = 1.0f / sqrtf(power);
            for (int n = 0; n < impulsesamples; n++)
                c.impulse[n] *= scale;

            // partition the impulse response
            c.h = new UnityComplexNumber*[data->numpartitions];
            c.x = new UnityComplexNumber*[data->numpartitions];
            float* src = c.impulse;
            for (int k = 0; k < data->numpartitions; k++)
            {
                c.h[k] = new UnityComplexNumber[data->fftsize];
                c.x[k] = new UnityComplexNumber[data->fftsize];
                memset(c.x[k], 0, sizeof(UnityComplexNumber) * data->fftsize);
                memset(c.h[k], 0, sizeof(UnityComplexNumber) * data->fftsize);
                for (int n = 0; n < data->hopsize; n++)
                    c.h[k][n].re = *src++;
                FFT::Forward(c.h[k], data->fftsize, false);
            }

            // integrate peak detection filtered impulse for later resampling via box-filtering when GUI requests preview waveform
            double sum = 0.0, peak = 0.0;
            for (int n = 0; n < impulsesamples; n++)
            {
                float a = fabsf(c.impulse[n]);
                if (a > peak)
                    peak = a;
                else
                    peak = peak * 0.99f + 1.0e-9f;
                sum += peak;
                c.impulse[n] = (float)sum;
            }
            double dc = -sum / (double)impulsesamples;
            sum = 0.0;
            for (int n = 0; n < impulsesamples; n++)
            {
                c.impulse[n] -= (float)sum;
                sum -= dc;
            }
        }
    }